

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall asmjit::_abi_1_10::BaseBuilder::serializeTo(BaseBuilder *this,BaseEmitter *dst)

{
  undefined8 *puVar1;
  NodeFlags NVar2;
  NodeType NVar3;
  byte bVar4;
  uint32_t uVar5;
  char *pcVar6;
  CodeHolder *pCVar7;
  undefined8 uVar8;
  BaseNode *pBVar9;
  uint uVar10;
  Error EVar11;
  long lVar12;
  anon_union_4_5_b2977b59_for_BaseNode_2 *paVar13;
  long lVar14;
  undefined8 *puVar15;
  CommentNode *node;
  BaseNode *pBVar16;
  Operand_ opArray [6];
  undefined4 local_c0;
  undefined4 local_bc;
  undefined8 local_b8;
  BaseBuilder *local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined8 local_a0;
  undefined1 auStack_98 [48];
  undefined8 local_68;
  anon_union_8_2_effa25e6_for_BaseNode_10 aStack_60;
  undefined8 auStack_58 [5];
  
  pBVar16 = this->_firstNode;
  local_b0 = this;
  do {
    pcVar6 = pBVar16->_inlineComment;
    dst->_inlineComment = pcVar6;
    NVar2 = (pBVar16->field_1)._any._nodeFlags;
    if ((NVar2 & kActsAsInst) != kNone) {
      uVar5 = *(uint32_t *)((long)&pBVar16[1].field_0 + 0xc);
      uVar8 = *(undefined8 *)((long)&pBVar16[1].field_0.field_0._prev + 4);
      dst->_instOptions = (int)uVar8;
      (dst->_extraReg)._signature = (Signature)(int)((ulong)uVar8 >> 0x20);
      (dst->_extraReg)._id = uVar5;
      bVar4 = (pBVar16->field_1)._any._reserved0;
      puVar15 = (undefined8 *)EmitterUtils::noExt;
      if (3 < bVar4) {
        local_68._0_4_ = pBVar16[2].field_1;
        local_68._4_4_ = pBVar16[2]._position;
        aStack_60 = pBVar16[2].field_3;
        uVar10 = 4;
        puVar15 = &local_68;
        if (bVar4 != 4) {
          lVar12 = (ulong)bVar4 - 4;
          lVar14 = 0;
          do {
            puVar1 = (undefined8 *)((long)&pBVar16[2]._passData + lVar14);
            uVar8 = puVar1[1];
            *(undefined8 *)((long)auStack_58 + lVar14) = *puVar1;
            *(undefined8 *)((long)auStack_58 + lVar14 + 8) = uVar8;
            lVar14 = lVar14 + 0x10;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
          uVar10 = (uint)bVar4;
          if (5 < bVar4) goto LAB_0011772b;
        }
        memset(auStack_98 + uVar10 * 0x10,0,(ulong)(uVar10 * -0x10 + 0x50) + 0x10);
      }
LAB_0011772b:
      EVar11 = (*dst->_vptr_BaseEmitter[7])
                         (dst,(ulong)*(uint *)&pBVar16[1].field_0,&pBVar16[1].field_1,
                          &pBVar16[1]._passData,pBVar16 + 2,puVar15);
      goto LAB_00117744;
    }
    NVar3 = (pBVar16->field_1)._any._nodeType;
    if ((NVar2 & kActsAsLabel) != kNone) {
      if (NVar3 == kConstPool) {
        local_bc = *(undefined4 *)&pBVar16[1].field_0;
        local_c0 = 4;
        local_b8 = 0;
        EVar11 = (*dst->_vptr_BaseEmitter[0xc])
                           (dst,&local_c0,(undefined1 *)((long)&pBVar16[1].field_0 + 8));
      }
      else {
        local_bc = *(undefined4 *)&pBVar16[1].field_0;
        local_c0 = 4;
        local_b8 = 0;
        EVar11 = (*dst->_vptr_BaseEmitter[6])(dst,&local_c0);
      }
      goto LAB_00117744;
    }
    switch(NVar3) {
    case kSection:
      pCVar7 = (local_b0->super_BaseEmitter)._code;
      if ((pCVar7->_sections).super_ZoneVectorBase._size <= *(uint *)&pBVar16[1].field_0) {
        serializeTo();
      }
      EVar11 = (*dst->_vptr_BaseEmitter[3])
                         (dst,*(undefined8 *)
                               ((long)(pCVar7->_sections).super_ZoneVectorBase._data +
                               (ulong)*(uint *)&pBVar16[1].field_0 * 8));
      break;
    default:
      goto switchD_00117680_caseD_3;
    case kAlign:
      EVar11 = (*dst->_vptr_BaseEmitter[9])
                         (dst,(ulong)(pBVar16->field_1)._any._reserved0,
                          (ulong)*(uint *)&pBVar16[1].field_0);
      break;
    case kEmbedData:
      pBVar9 = pBVar16[1].field_0.field_0._prev;
      if ((ulong)(pBVar16->field_1)._any._reserved1 * (long)pBVar9 < 0x41) {
        paVar13 = &pBVar16[1].field_1;
      }
      else {
        paVar13 = *(anon_union_4_5_b2977b59_for_BaseNode_2 **)&pBVar16[1].field_1;
      }
      EVar11 = (*dst->_vptr_BaseEmitter[0xb])
                         (dst,(ulong)(pBVar16->field_1)._any._reserved0,paVar13,pBVar9,
                          pBVar16[1].field_0.field_0._next);
      break;
    case kEmbedLabel:
      local_bc = *(undefined4 *)&pBVar16[1].field_0;
      local_c0 = 4;
      local_b8 = 0;
      EVar11 = (*dst->_vptr_BaseEmitter[0xd])
                         (dst,&local_c0,(ulong)*(uint *)((long)&pBVar16[1].field_0 + 4));
      break;
    case kEmbedLabelDelta:
      local_bc = *(undefined4 *)&pBVar16[1].field_0;
      local_c0 = 4;
      local_b8 = 0;
      local_a4 = *(undefined4 *)((long)&pBVar16[1].field_0 + 4);
      local_a8 = 4;
      local_a0 = 0;
      EVar11 = (*dst->_vptr_BaseEmitter[0xe])
                         (dst,&local_c0,&local_a8,(ulong)*(uint *)((long)&pBVar16[1].field_0 + 8));
      break;
    case kComment:
      EVar11 = (*dst->_vptr_BaseEmitter[0xf])(dst,pcVar6,0xffffffffffffffff);
    }
LAB_00117744:
    if (EVar11 != 0) {
      return EVar11;
    }
switchD_00117680_caseD_3:
    pBVar16 = (pBVar16->field_0).field_0._next;
    if (pBVar16 == (BaseNode *)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

Error BaseBuilder::serializeTo(BaseEmitter* dst) {
  Error err = kErrorOk;
  BaseNode* node_ = _firstNode;

  Operand_ opArray[Globals::kMaxOpCount];

  do {
    dst->setInlineComment(node_->inlineComment());

    if (node_->isInst()) {
      InstNode* node = node_->as<InstNode>();

      // NOTE: Inlined to remove one additional call per instruction.
      dst->setInstOptions(node->options());
      dst->setExtraReg(node->extraReg());

      const Operand_* op = node->operands();
      const Operand_* opExt = EmitterUtils::noExt;

      uint32_t opCount = node->opCount();
      if (opCount > 3) {
        uint32_t i = 4;
        opArray[3] = op[3];

        while (i < opCount) {
          opArray[i].copyFrom(op[i]);
          i++;
        }
        while (i < Globals::kMaxOpCount) {
          opArray[i].reset();
          i++;
        }
        opExt = opArray + 3;
      }

      err = dst->_emit(node->id(), op[0], op[1], op[2], opExt);
    }
    else if (node_->isLabel()) {
      if (node_->isConstPool()) {
        ConstPoolNode* node = node_->as<ConstPoolNode>();
        err = dst->embedConstPool(node->label(), node->constPool());
      }
      else {
        LabelNode* node = node_->as<LabelNode>();
        err = dst->bind(node->label());
      }
    }
    else if (node_->isAlign()) {
      AlignNode* node = node_->as<AlignNode>();
      err = dst->align(node->alignMode(), node->alignment());
    }
    else if (node_->isEmbedData()) {
      EmbedDataNode* node = node_->as<EmbedDataNode>();
      err = dst->embedDataArray(node->typeId(), node->data(), node->itemCount(), node->repeatCount());
    }
    else if (node_->isEmbedLabel()) {
      EmbedLabelNode* node = node_->as<EmbedLabelNode>();
      err = dst->embedLabel(node->label(), node->dataSize());
    }
    else if (node_->isEmbedLabelDelta()) {
      EmbedLabelDeltaNode* node = node_->as<EmbedLabelDeltaNode>();
      err = dst->embedLabelDelta(node->label(), node->baseLabel(), node->dataSize());
    }
    else if (node_->isSection()) {
      SectionNode* node = node_->as<SectionNode>();
      err = dst->section(_code->sectionById(node->id()));
    }
    else if (node_->isComment()) {
      CommentNode* node = node_->as<CommentNode>();
      err = dst->comment(node->inlineComment());
    }

    if (err) break;
    node_ = node_->next();
  } while (node_);

  return err;
}